

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Xor_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = TaggedInt::Is(aLeft);
  if (bVar1) {
    uVar2 = TaggedInt::ToInt32(aLeft);
  }
  else {
    uVar2 = JavascriptConversion::ToInt32(aLeft,scriptContext);
  }
  bVar1 = TaggedInt::Is(aRight);
  if (bVar1) {
    uVar3 = TaggedInt::ToInt32(aRight);
  }
  else {
    uVar3 = JavascriptConversion::ToInt32(aRight,scriptContext);
  }
  return (Var)((ulong)(uVar3 ^ uVar2) | 0x1000000000000);
}

Assistant:

Var JavascriptMath::Xor_Full(Var aLeft, Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Xor_Full);
            int32 nLeft = TaggedInt::Is(aLeft) ? TaggedInt::ToInt32(aLeft) : JavascriptConversion::ToInt32(aLeft, scriptContext);
            int32 nRight = TaggedInt::Is(aRight) ? TaggedInt::ToInt32(aRight) : JavascriptConversion::ToInt32(aRight, scriptContext);

            return JavascriptNumber::ToVar(nLeft ^ nRight,scriptContext);
            JIT_HELPER_END(Op_Xor_Full);
        }